

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O2

void Js::JavascriptOperators::ObjectToNativeArray<Js::JavascriptNativeIntArray>
               (JavascriptNativeIntArray *arrayObject,JsNativeValueType valueType,UINT length,
               UINT elementSize,byte *buffer,ScriptContext *scriptContext)

{
  code *pcVar1;
  bool bVar2;
  byte bVar3;
  uint8 uVar4;
  int16 iVar5;
  uint16 uVar6;
  int32 iVar7;
  uint32 uVar8;
  int iVar9;
  charcount_t cVar10;
  ulong uVar11;
  undefined4 *puVar12;
  unsigned_long uVar13;
  long lVar14;
  Var pvVar15;
  JavascriptString *this;
  undefined4 extraout_var;
  ulong uVar16;
  ulong uVar17;
  float fVar18;
  double dVar19;
  undefined4 *local_60;
  undefined4 *local_38;
  
  if ((int)((ulong)length * (ulong)elementSize >> 0x20) != 0) {
    ::Math::DefaultOverflowPolicy();
  }
  if (valueType < (JsNativeStringType|JsUint8Type)) {
    uVar11 = (ulong)length * (ulong)elementSize & 0xffffffff;
    switch(valueType) {
    case JsInt8Type:
      if (elementSize == 1) {
        puVar12 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      }
      else {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar12 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar12 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                    ,0x2904,"(elementSize == sizeof(int8))",
                                    "elementSize == sizeof(int8)");
        if (!bVar2) goto LAB_009b6fda;
        *puVar12 = 0;
      }
      for (uVar17 = 0; length != uVar17; uVar17 = uVar17 + 1) {
        pvVar15 = GetElementAtIndex<Js::JavascriptNativeIntArray>
                            (arrayObject,(UINT)uVar17,scriptContext);
        if (uVar11 <= uVar17) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          *puVar12 = 1;
          bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                      ,0x2908,"((i + 1) * sizeof(int8) <= allocSize)",
                                      "(i + 1) * sizeof(int8) <= allocSize");
          if (!bVar2) goto LAB_009b6fda;
          *puVar12 = 0;
        }
        bVar3 = JavascriptConversion::ToInt8(pvVar15,scriptContext);
        buffer[uVar17] = bVar3;
      }
      break;
    case JsUint8Type:
      if (elementSize == 1) {
        puVar12 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      }
      else {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar12 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar12 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                    ,0x290e,"(elementSize == sizeof(uint8))",
                                    "elementSize == sizeof(uint8)");
        if (!bVar2) goto LAB_009b6fda;
        *puVar12 = 0;
      }
      for (uVar17 = 0; length != uVar17; uVar17 = uVar17 + 1) {
        pvVar15 = GetElementAtIndex<Js::JavascriptNativeIntArray>
                            (arrayObject,(UINT)uVar17,scriptContext);
        if (uVar11 <= uVar17) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          *puVar12 = 1;
          bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                      ,0x2912,"((i + 1) * sizeof(uint8) <= allocSize)",
                                      "(i + 1) * sizeof(uint8) <= allocSize");
          if (!bVar2) goto LAB_009b6fda;
          *puVar12 = 0;
        }
        uVar4 = JavascriptConversion::ToUInt8(pvVar15,scriptContext);
        buffer[uVar17] = uVar4;
      }
      break;
    case JsInt16Type:
      if (elementSize == 2) {
        local_38 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      }
      else {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        local_38 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *local_38 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                    ,0x2917,"(elementSize == sizeof(int16))",
                                    "elementSize == sizeof(int16)");
        if (!bVar2) goto LAB_009b6fda;
        *local_38 = 0;
      }
      uVar17 = 2;
      for (uVar16 = 0; length != uVar16; uVar16 = uVar16 + 1) {
        pvVar15 = GetElementAtIndex<Js::JavascriptNativeIntArray>
                            (arrayObject,(UINT)uVar16,scriptContext);
        if (uVar11 < uVar17) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          *local_38 = 1;
          bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                      ,0x291b,"((i + 1) * sizeof(int16) <= allocSize)",
                                      "(i + 1) * sizeof(int16) <= allocSize");
          if (!bVar2) goto LAB_009b6fda;
          *local_38 = 0;
        }
        iVar5 = JavascriptConversion::ToInt16(pvVar15,scriptContext);
        *(int16 *)(buffer + uVar16 * 2) = iVar5;
        uVar17 = uVar17 + 2;
      }
      break;
    case JsUint16Type:
      if (elementSize == 2) {
        local_38 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      }
      else {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        local_38 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *local_38 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                    ,0x2920,"(elementSize == sizeof(uint16))",
                                    "elementSize == sizeof(uint16)");
        if (!bVar2) goto LAB_009b6fda;
        *local_38 = 0;
      }
      uVar17 = 2;
      for (uVar16 = 0; length != uVar16; uVar16 = uVar16 + 1) {
        pvVar15 = GetElementAtIndex<Js::JavascriptNativeIntArray>
                            (arrayObject,(UINT)uVar16,scriptContext);
        if (uVar11 < uVar17) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          *local_38 = 1;
          bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                      ,0x2924,"((i + 1) * sizeof(uint16) <= allocSize)",
                                      "(i + 1) * sizeof(uint16) <= allocSize");
          if (!bVar2) goto LAB_009b6fda;
          *local_38 = 0;
        }
        uVar6 = JavascriptConversion::ToUInt16(pvVar15,scriptContext);
        *(uint16 *)(buffer + uVar16 * 2) = uVar6;
        uVar17 = uVar17 + 2;
      }
      break;
    case JsInt32Type:
      if (elementSize == 4) {
        local_38 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      }
      else {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        local_38 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *local_38 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                    ,0x2929,"(elementSize == sizeof(int32))",
                                    "elementSize == sizeof(int32)");
        if (!bVar2) goto LAB_009b6fda;
        *local_38 = 0;
      }
      uVar17 = 4;
      for (uVar16 = 0; length != uVar16; uVar16 = uVar16 + 1) {
        pvVar15 = GetElementAtIndex<Js::JavascriptNativeIntArray>
                            (arrayObject,(UINT)uVar16,scriptContext);
        if (uVar11 < uVar17) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          *local_38 = 1;
          bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                      ,0x292d,"((i + 1) * sizeof(int32) <= allocSize)",
                                      "(i + 1) * sizeof(int32) <= allocSize");
          if (!bVar2) goto LAB_009b6fda;
          *local_38 = 0;
        }
        iVar7 = JavascriptConversion::ToInt32(pvVar15,scriptContext);
        *(int32 *)(buffer + uVar16 * 4) = iVar7;
        uVar17 = uVar17 + 4;
      }
      break;
    case JsUint32Type:
      if (elementSize == 4) {
        local_38 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      }
      else {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        local_38 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *local_38 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                    ,0x2932,"(elementSize == sizeof(uint32))",
                                    "elementSize == sizeof(uint32)");
        if (!bVar2) goto LAB_009b6fda;
        *local_38 = 0;
      }
      uVar17 = 4;
      for (uVar16 = 0; length != uVar16; uVar16 = uVar16 + 1) {
        pvVar15 = GetElementAtIndex<Js::JavascriptNativeIntArray>
                            (arrayObject,(UINT)uVar16,scriptContext);
        if (uVar11 < uVar17) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          *local_38 = 1;
          bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                      ,0x2936,"((i + 1) * sizeof(uint32) <= allocSize)",
                                      "(i + 1) * sizeof(uint32) <= allocSize");
          if (!bVar2) goto LAB_009b6fda;
          *local_38 = 0;
        }
        uVar8 = JavascriptConversion::ToUInt32(pvVar15,scriptContext);
        *(uint32 *)(buffer + uVar16 * 4) = uVar8;
        uVar17 = uVar17 + 4;
      }
      break;
    case JsInt64Type:
      if (elementSize == 8) {
        local_38 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      }
      else {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        local_38 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *local_38 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                    ,0x293b,"(elementSize == sizeof(int64))",
                                    "elementSize == sizeof(int64)");
        if (!bVar2) goto LAB_009b6fda;
        *local_38 = 0;
      }
      uVar17 = 8;
      for (uVar16 = 0; length != uVar16; uVar16 = uVar16 + 1) {
        pvVar15 = GetElementAtIndex<Js::JavascriptNativeIntArray>
                            (arrayObject,(UINT)uVar16,scriptContext);
        if (uVar11 < uVar17) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          *local_38 = 1;
          bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                      ,0x293f,"((i + 1) * sizeof(int64) <= allocSize)",
                                      "(i + 1) * sizeof(int64) <= allocSize");
          if (!bVar2) goto LAB_009b6fda;
          *local_38 = 0;
        }
        lVar14 = JavascriptConversion::ToInt64(pvVar15,scriptContext);
        *(long *)(buffer + uVar16 * 8) = lVar14;
        uVar17 = uVar17 + 8;
      }
      break;
    case JsUint64Type:
      if (elementSize == 8) {
        local_38 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      }
      else {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        local_38 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *local_38 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                    ,0x2944,"(elementSize == sizeof(uint64))",
                                    "elementSize == sizeof(uint64)");
        if (!bVar2) goto LAB_009b6fda;
        *local_38 = 0;
      }
      uVar17 = 8;
      for (uVar16 = 0; length != uVar16; uVar16 = uVar16 + 1) {
        pvVar15 = GetElementAtIndex<Js::JavascriptNativeIntArray>
                            (arrayObject,(UINT)uVar16,scriptContext);
        if (uVar11 < uVar17) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          *local_38 = 1;
          bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                      ,0x2948,"((i + 1) * sizeof(uint64) <= allocSize)",
                                      "(i + 1) * sizeof(uint64) <= allocSize");
          if (!bVar2) goto LAB_009b6fda;
          *local_38 = 0;
        }
        uVar13 = JavascriptConversion::ToUInt64(pvVar15,scriptContext);
        *(unsigned_long *)(buffer + uVar16 * 8) = uVar13;
        uVar17 = uVar17 + 8;
      }
      break;
    case JsFloatType:
      if (elementSize == 4) {
        local_38 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      }
      else {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        local_38 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *local_38 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                    ,0x294d,"(elementSize == sizeof(float))",
                                    "elementSize == sizeof(float)");
        if (!bVar2) goto LAB_009b6fda;
        *local_38 = 0;
      }
      uVar17 = 4;
      for (uVar16 = 0; length != uVar16; uVar16 = uVar16 + 1) {
        pvVar15 = GetElementAtIndex<Js::JavascriptNativeIntArray>
                            (arrayObject,(UINT)uVar16,scriptContext);
        if (uVar11 < uVar17) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          *local_38 = 1;
          bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                      ,0x2951,"((i + 1) * sizeof(float) <= allocSize)",
                                      "(i + 1) * sizeof(float) <= allocSize");
          if (!bVar2) goto LAB_009b6fda;
          *local_38 = 0;
        }
        fVar18 = JavascriptConversion::ToFloat(pvVar15,scriptContext);
        *(float *)(buffer + uVar16 * 4) = fVar18;
        uVar17 = uVar17 + 4;
      }
      break;
    case JsDoubleType:
      if (elementSize == 8) {
        local_38 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      }
      else {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        local_38 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *local_38 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                    ,0x2956,"(elementSize == sizeof(double))",
                                    "elementSize == sizeof(double)");
        if (!bVar2) goto LAB_009b6fda;
        *local_38 = 0;
      }
      uVar17 = 8;
      for (uVar16 = 0; length != uVar16; uVar16 = uVar16 + 1) {
        pvVar15 = GetElementAtIndex<Js::JavascriptNativeIntArray>
                            (arrayObject,(UINT)uVar16,scriptContext);
        if (uVar11 < uVar17) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          *local_38 = 1;
          bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                      ,0x295a,"((i + 1) * sizeof(double) <= allocSize)",
                                      "(i + 1) * sizeof(double) <= allocSize");
          if (!bVar2) goto LAB_009b6fda;
          *local_38 = 0;
        }
        dVar19 = JavascriptConversion::ToNumber(pvVar15,scriptContext);
        *(double *)(buffer + uVar16 * 8) = dVar19;
        uVar17 = uVar17 + 8;
      }
      break;
    case JsNativeStringType:
      if (elementSize == 0x10) {
        local_60 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      }
      else {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        local_60 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *local_60 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                    ,0x295f,"(elementSize == sizeof(JsNativeString))",
                                    "elementSize == sizeof(JsNativeString)");
        if (!bVar2) goto LAB_009b6fda;
        *local_60 = 0;
      }
      uVar17 = 0x10;
      for (uVar16 = 0; length != uVar16; uVar16 = uVar16 + 1) {
        pvVar15 = GetElementAtIndex<Js::JavascriptNativeIntArray>
                            (arrayObject,(UINT)uVar16,scriptContext);
        if (uVar11 < uVar17) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          *local_60 = 1;
          bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                      ,0x2963,"((i + 1) * sizeof(JsNativeString) <= allocSize)",
                                      "(i + 1) * sizeof(JsNativeString) <= allocSize");
          if (!bVar2) goto LAB_009b6fda;
          *local_60 = 0;
        }
        this = JavascriptConversion::ToString(pvVar15,scriptContext);
        iVar9 = (*(this->super_RecyclableObject).super_FinalizableObject.
                  super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x65])(this);
        *(ulong *)(buffer + (uVar17 - 8)) = CONCAT44(extraout_var,iVar9);
        cVar10 = JavascriptString::GetLength(this);
        *(charcount_t *)(buffer + (uVar17 - 0x10)) = cVar10;
        uVar17 = uVar17 + 0x10;
      }
    }
  }
  else {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar12 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar12 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                ,0x296a,"(0)","FALSE");
    if (!bVar2) {
LAB_009b6fda:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar12 = 0;
  }
  return;
}

Assistant:

void JavascriptOperators::ObjectToNativeArray(T* arrayObject,
        JsNativeValueType valueType,
        __in UINT length,
        __in UINT elementSize,
        __out_bcount(length*elementSize) byte* buffer,
        Js::ScriptContext* scriptContext)
    {
        Var element;
        uint64 allocSize = UInt32Math::Mul(length, elementSize);

        // TODO:further fast path the call for things like IntArray convert to int, floatarray convert to float etc.
        // such that we don't need boxing.
        switch (valueType)
        {
        case JsInt8Type:
            AnalysisAssert(elementSize == sizeof(int8));
            for (UINT i = 0; i < length; i++)
            {
                element = GetElementAtIndex(arrayObject, i, scriptContext);
                AnalysisAssert((i + 1) * sizeof(int8) <= allocSize);
#pragma prefast(suppress:22102)
                ((int8*)buffer)[i] = Js::JavascriptConversion::ToInt8(element, scriptContext);
            }
            break;
        case JsUint8Type:
            AnalysisAssert(elementSize == sizeof(uint8));
            for (UINT i = 0; i < length; i++)
            {
                element = GetElementAtIndex(arrayObject, i, scriptContext);
                AnalysisAssert((i + 1) * sizeof(uint8) <= allocSize);
                ((uint8*)buffer)[i] = Js::JavascriptConversion::ToUInt8(element, scriptContext);
            }
            break;
        case JsInt16Type:
            AnalysisAssert(elementSize == sizeof(int16));
            for (UINT i = 0; i < length; i++)
            {
                element = GetElementAtIndex(arrayObject, i, scriptContext);
                AnalysisAssert((i + 1) * sizeof(int16) <= allocSize);
                ((int16*)buffer)[i] = Js::JavascriptConversion::ToInt16(element, scriptContext);
            }
            break;
        case JsUint16Type:
            AnalysisAssert(elementSize == sizeof(uint16));
            for (UINT i = 0; i < length; i++)
            {
                element = GetElementAtIndex(arrayObject, i, scriptContext);
                AnalysisAssert((i + 1) * sizeof(uint16) <= allocSize);
                ((uint16*)buffer)[i] = Js::JavascriptConversion::ToUInt16(element, scriptContext);
            }
            break;
        case JsInt32Type:
            AnalysisAssert(elementSize == sizeof(int32));
            for (UINT i = 0; i < length; i++)
            {
                element = GetElementAtIndex(arrayObject, i, scriptContext);
                AnalysisAssert((i + 1) * sizeof(int32) <= allocSize);
                ((int32*)buffer)[i] = Js::JavascriptConversion::ToInt32(element, scriptContext);
            }
            break;
        case JsUint32Type:
            AnalysisAssert(elementSize == sizeof(uint32));
            for (UINT i = 0; i < length; i++)
            {
                element = GetElementAtIndex(arrayObject, i, scriptContext);
                AnalysisAssert((i + 1) * sizeof(uint32) <= allocSize);
                ((uint32*)buffer)[i] = Js::JavascriptConversion::ToUInt32(element, scriptContext);
            }
            break;
        case JsInt64Type:
            AnalysisAssert(elementSize == sizeof(int64));
            for (UINT i = 0; i < length; i++)
            {
                element = GetElementAtIndex(arrayObject, i, scriptContext);
                AnalysisAssert((i + 1) * sizeof(int64) <= allocSize);
                ((int64*)buffer)[i] = Js::JavascriptConversion::ToInt64(element, scriptContext);
            }
            break;
        case JsUint64Type:
            AnalysisAssert(elementSize == sizeof(uint64));
            for (UINT i = 0; i < length; i++)
            {
                element = GetElementAtIndex(arrayObject, i, scriptContext);
                AnalysisAssert((i + 1) * sizeof(uint64) <= allocSize);
                ((uint64*)buffer)[i] = Js::JavascriptConversion::ToUInt64(element, scriptContext);
            }
            break;
        case JsFloatType:
            AnalysisAssert(elementSize == sizeof(float));
            for (UINT i = 0; i < length; i++)
            {
                element = GetElementAtIndex(arrayObject, i, scriptContext);
                AnalysisAssert((i + 1) * sizeof(float) <= allocSize);
                ((float*)buffer)[i] = Js::JavascriptConversion::ToFloat(element, scriptContext);
            }
            break;
        case JsDoubleType:
            AnalysisAssert(elementSize == sizeof(double));
            for (UINT i = 0; i < length; i++)
            {
                element = GetElementAtIndex(arrayObject, i, scriptContext);
                AnalysisAssert((i + 1) * sizeof(double) <= allocSize);
                ((double*)buffer)[i] = Js::JavascriptConversion::ToNumber(element, scriptContext);
            }
            break;
        case JsNativeStringType:
            AnalysisAssert(elementSize == sizeof(JsNativeString));
            for (UINT i = 0; i < length; i++)
            {
                element = GetElementAtIndex(arrayObject, i, scriptContext);
                AnalysisAssert((i + 1) * sizeof(JsNativeString) <= allocSize);
                Js::JavascriptString* string = Js::JavascriptConversion::ToString(element, scriptContext);
                (((JsNativeString*)buffer)[i]).str = string->GetSz();
                (((JsNativeString*)buffer)[i]).length = string->GetLength();
            }
            break;
        default:
            Assert(FALSE);
        }
    }